

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::GlobalValueChangeFunc::GlobalValueChangeFunc
          (GlobalValueChangeFunc *this,KnownSystemName knownNameId,bool isFuture)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__GlobalValueChangeFunc_01a2c5c8;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

GlobalValueChangeFunc(KnownSystemName knownNameId, bool isFuture) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isFuture(isFuture) {}